

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::anon_unknown_2::GenerateEnumToPool
               (EnumDescriptor *en,Printer *printer)

{
  int iVar1;
  Printer *this;
  int iVar2;
  uint uVar3;
  string *psVar4;
  int32 value_00;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  EnumValueDescriptor *local_50;
  EnumValueDescriptor *value;
  int i;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  EnumDescriptor *en_local;
  
  local_18 = printer;
  printer_local = (Printer *)en;
  DescriptorFullName<google::protobuf::EnumDescriptor>(&local_38,en,true);
  psVar4 = EnumDescriptor::name_abi_cxx11_((EnumDescriptor *)printer_local);
  io::Printer::Print<char[5],std::__cxx11::string,char[11],std::__cxx11::string>
            (printer,
             "$pool->addEnum(\'^name^\', \\Google\\Protobuf\\Internal\\^class_name^::class)\n",
             (char (*) [5])0x77db8d,&local_38,(char (*) [11])0x7702be,psVar4);
  std::__cxx11::string::~string((string *)&local_38);
  Indent(local_18);
  value._0_4_ = 0;
  while( true ) {
    iVar1 = (int)value;
    iVar2 = EnumDescriptor::value_count((EnumDescriptor *)printer_local);
    if (iVar2 <= iVar1) break;
    local_50 = EnumDescriptor::value((EnumDescriptor *)printer_local,(int)value);
    this = local_18;
    psVar4 = EnumValueDescriptor::name_abi_cxx11_(local_50);
    ConstantNamePrefix(&local_90,psVar4);
    psVar4 = EnumValueDescriptor::name_abi_cxx11_(local_50);
    std::operator+(&local_70,&local_90,psVar4);
    uVar3 = EnumValueDescriptor::number(local_50);
    (anonymous_namespace)::IntToString_abi_cxx11_
              (&local_b0,(_anonymous_namespace_ *)(ulong)uVar3,value_00);
    io::Printer::Print<char[5],std::__cxx11::string,char[7],std::__cxx11::string>
              (this,"->value(\"^name^\", ^number^)\n",(char (*) [5])0x77db8d,&local_70,
               (char (*) [7])0x79279d,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    value._0_4_ = (int)value + 1;
  }
  io::Printer::Print<>(local_18,"->finalizeToPool();\n\n");
  Outdent(local_18);
  return;
}

Assistant:

void GenerateEnumToPool(const EnumDescriptor* en, io::Printer* printer) {
  printer->Print(
      "$pool->addEnum('^name^', "
      "\\Google\\Protobuf\\Internal\\^class_name^::class)\n",
      "name", DescriptorFullName(en, true),
      "class_name", en->name());
  Indent(printer);

  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    printer->Print(
        "->value(\"^name^\", ^number^)\n",
        "name", ConstantNamePrefix(value->name()) + value->name(),
        "number", IntToString(value->number()));
  }
  printer->Print("->finalizeToPool();\n\n");
  Outdent(printer);
}